

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase363::run(TestCase363 *this)

{
  bool bVar1;
  Type *func;
  bool local_1f9;
  undefined1 *puStack_1f8;
  bool _kj_shouldLog;
  undefined1 *local_1f0;
  Maybe<kj::Exception> local_1e8;
  undefined1 local_88 [8];
  PromiseFulfillerPair<int> pair;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase363 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  newPromiseAndFulfiller<int>();
  Own<kj::PromiseFulfiller<int>_>::operator=
            ((Own<kj::PromiseFulfiller<int>_> *)&pair.promise.super_PromiseBase.node.ptr,(void *)0x0
            );
  puStack_1f8 = local_88;
  local_1f0 = local_58;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase363::run()::__0>
            (&local_1e8,(kj *)&stack0xfffffffffffffe08,func);
  bVar1 = Maybe<kj::Exception>::operator!=(&local_1e8,(void *)0x0);
  Maybe<kj::Exception>::~Maybe(&local_1e8);
  if (!bVar1) {
    local_1f9 = _::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      _::Debug::log<char_const(&)[97]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x172,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pair.promise.wait(waitScope); }) != nullptr\""
                 ,(char (*) [97])
                  "failed: expected ::kj::runCatchingExceptions([&]() { pair.promise.wait(waitScope); }) != nullptr"
                );
      local_1f9 = false;
    }
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair((PromiseFulfillerPair<int> *)local_88);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerDiscarded) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<int>();
  pair.fulfiller = nullptr;

  EXPECT_ANY_THROW(pair.promise.wait(waitScope));
}